

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__gif_info_raw(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__gif *g_00;
  stbi__context *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  stbi__gif *g;
  int *in_stack_ffffffffffffffc8;
  int local_4;
  
  g_00 = (stbi__gif *)stbi__malloc(0x176ca2);
  iVar1 = stbi__gif_header(in_RCX,g_00,in_stack_ffffffffffffffc8,0);
  if (iVar1 == 0) {
    free(g_00);
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  else {
    if (in_RSI != (int *)0x0) {
      *in_RSI = g_00->w;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = g_00->h;
    }
    free(g_00);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__gif_info_raw(stbi__context *s, int *x, int *y, int *comp)
{
   stbi__gif* g = (stbi__gif*) stbi__malloc(sizeof(stbi__gif));
   if (!stbi__gif_header(s, g, comp, 1)) {
      STBI_FREE(g);
      stbi__rewind( s );
      return 0;
   }
   if (x) *x = g->w;
   if (y) *y = g->h;
   STBI_FREE(g);
   return 1;
}